

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::complex<long_double>_>::Resize
          (TPZVec<std::complex<long_double>_> *this,int64_t newsize,complex<long_double> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  complex<long_double> *pcVar6;
  complex<long_double> *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      pcVar6 = (complex<long_double> *)0x0;
    }
    else {
      pcVar6 = (complex<long_double> *)
               operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize * 0x20);
      pcVar7 = pcVar6;
      do {
        *(longdouble *)pcVar7->_M_value = (longdouble)0;
        *(longdouble *)((long)pcVar7->_M_value + 0x10) = (longdouble)0;
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != pcVar6 + newsize);
    }
    if (newsize <= lVar10) {
      lVar10 = newsize;
    }
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    else {
      pcVar7 = this->fStore;
      lVar8 = 0;
      lVar9 = lVar10;
      do {
        puVar1 = (undefined8 *)(pcVar7->_M_value + lVar8);
        uVar3 = *puVar1;
        uVar4 = puVar1[1];
        puVar1 = (undefined8 *)(pcVar7->_M_value + lVar8 + 0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar6->_M_value + lVar8 + 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)((long)pcVar6->_M_value + lVar8);
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
        lVar8 = lVar8 + 0x20;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    lVar9 = newsize - lVar10;
    if (lVar9 != 0 && lVar10 <= newsize) {
      pcVar7 = pcVar6 + lVar10;
      do {
        uVar3 = *(undefined8 *)object->_M_value;
        uVar4 = *(undefined8 *)(object->_M_value + 8);
        uVar5 = *(undefined8 *)(object->_M_value + 0x18);
        *(undefined8 *)((long)pcVar7->_M_value + 0x10) = *(undefined8 *)(object->_M_value + 0x10);
        *(undefined8 *)((long)pcVar7->_M_value + 0x18) = uVar5;
        *(undefined8 *)pcVar7->_M_value = uVar3;
        *(undefined8 *)((long)pcVar7->_M_value + 8) = uVar4;
        pcVar7 = pcVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (this->fStore != (complex<long_double> *)0x0) {
      operator_delete__(this->fStore);
    }
    this->fStore = pcVar6;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}